

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.hpp
# Opt level: O0

Clause * Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>
                   (VirtualIterator<Kernel::Literal_*> *litit,Inference *inf)

{
  int iVar1;
  Clause *pCVar2;
  undefined8 *in_RSI;
  Inference *in_RDI;
  Stack<Kernel::Literal_*> *unaff_retaddr;
  Stack<Kernel::Literal_*> *this;
  size_t in_stack_ffffffffffffff98;
  VirtualIterator<Kernel::Literal_*> *this_00;
  Inference local_58;
  VirtualIterator<Kernel::Literal_*> local_28 [3];
  undefined8 *local_10;
  Inference *inf_00;
  
  local_10 = in_RSI;
  inf_00 = in_RDI;
  if (fromIterator<Lib::VirtualIterator<Kernel::Literal*>>(Lib::VirtualIterator<Kernel::Literal*>,Kernel::Inference_const&)
      ::st == '\0') {
    iVar1 = __cxa_guard_acquire(&fromIterator<Lib::VirtualIterator<Kernel::Literal*>>(Lib::VirtualIterator<Kernel::Literal*>,Kernel::Inference_const&)
                                 ::st);
    if (iVar1 != 0) {
      Lib::Stack<Kernel::Literal_*>::Stack
                ((Stack<Kernel::Literal_*> *)in_RDI,in_stack_ffffffffffffff98);
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,
                   &fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st,&__dso_handle);
      __cxa_guard_release(&fromIterator<Lib::VirtualIterator<Kernel::Literal*>>(Lib::VirtualIterator<Kernel::Literal*>,Kernel::Inference_const&)
                           ::st);
    }
  }
  this = &fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st;
  Lib::Stack<Kernel::Literal_*>::reset(&fromIterator<Lib::VirtualIterator<Kernel::Literal_*>_>::st);
  this_00 = local_28;
  Lib::VirtualIterator<Kernel::Literal_*>::VirtualIterator
            (this_00,(VirtualIterator<Kernel::Literal_*> *)in_RDI);
  Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::VirtualIterator<Kernel::Literal*>>
            ((Stack<Kernel::Literal_*> *)in_RDI,this_00);
  Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Literal_*> *)this);
  local_58._0_8_ = *local_10;
  local_58._8_8_ = local_10[1];
  local_58._splits = (SplitSet *)local_10[2];
  local_58._ptr1 = (void *)local_10[3];
  local_58._ptr2 = (void *)local_10[4];
  local_58._40_8_ = local_10[5];
  pCVar2 = fromStack(unaff_retaddr,inf_00);
  Inference::~Inference(&local_58);
  return pCVar2;
}

Assistant:

static Clause* fromIterator(Iter litit, const Inference& inf)
  {
    static Stack<Literal*> st;
    st.reset();
    st.loadFromIterator(std::move(litit));
    return fromStack(st, inf);
  }